

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

char * golf_file_copy_line(char *string,char **line_buffer,int *line_buffer_len)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  
  if ((string == (char *)0x0) || (cVar2 = *string, cVar2 == '\0')) {
    pcVar3 = (char *)0x0;
  }
  else {
    uVar4 = 0;
    while ((cVar2 != '\0' && (cVar2 != '\n'))) {
      if (uVar4 == (uint)*line_buffer_len) {
        _grow_buffer(line_buffer,line_buffer_len);
        cVar2 = string[uVar4];
      }
      (*line_buffer)[uVar4] = cVar2;
      lVar1 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      cVar2 = string[lVar1];
    }
    if ((uVar4 != 0) && ((*line_buffer)[uVar4 - 1] == '\r')) {
      (*line_buffer)[uVar4 - 1] = '\0';
    }
    if (*line_buffer_len == (int)uVar4) {
      _grow_buffer(line_buffer,line_buffer_len);
    }
    pcVar3 = string + uVar4;
    (*line_buffer)[uVar4] = '\0';
  }
  return pcVar3;
}

Assistant:

const char *golf_file_copy_line(const char *string, char **line_buffer, int *line_buffer_len) {
    if (!string || !string[0]) {
        return NULL;
    }

    int i = 0;
    while (string[i] != '\n' && string[i]) {
        if (i == *line_buffer_len) {
            _grow_buffer(line_buffer, line_buffer_len);
        }
        (*line_buffer)[i] = string[i];
        i++;
    }
    if (i > 0 && (*line_buffer)[i - 1] == '\r') {
        (*line_buffer)[i - 1] = 0;
    }

    // Allocate room for the null character if needed.
    if (i == *line_buffer_len) {
        _grow_buffer(line_buffer, line_buffer_len);
    }
    (*line_buffer)[i] = 0;

    return string + i;
}